

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::AddExtensionsForOperand
          (TrimCapabilitiesPass *this,spv_operand_type_t type,uint32_t value,
          ExtensionSet *extensions)

{
  spv_result_t sVar1;
  spv_operand_desc_t *desc;
  spv_operand_desc local_18;
  
  local_18 = (spv_operand_desc_t *)0x0;
  sVar1 = AssemblyGrammar::lookupOperand
                    (&((this->super_Pass).context_)->grammar_,type,value,&local_18);
  if (sVar1 == SPV_SUCCESS) {
    addSupportedExtensionsToSet<spv_operand_desc_t>(this,local_18,extensions);
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::AddExtensionsForOperand(
    const spv_operand_type_t type, const uint32_t value,
    ExtensionSet* extensions) const {
  const spv_operand_desc_t* desc = nullptr;
  spv_result_t result = context()->grammar().lookupOperand(type, value, &desc);
  if (result != SPV_SUCCESS) {
    return;
  }
  addSupportedExtensionsToSet(desc, extensions);
}